

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O2

bool __thiscall
CompareTxMemPoolEntryByScore::operator()
          (CompareTxMemPoolEntryByScore *this,CTxMemPoolEntry *a,CTxMemPoolEntry *b)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int32_t iVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = a->nFee;
  iVar4 = CTxMemPoolEntry::GetTxSize(b);
  dVar5 = (double)iVar4 * (double)lVar2;
  lVar2 = b->nFee;
  iVar4 = CTxMemPoolEntry::GetTxSize(a);
  dVar6 = (double)iVar4 * (double)lVar2;
  if ((dVar5 != dVar6) || (NAN(dVar5) || NAN(dVar6))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return dVar6 < dVar5;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    bVar3 = transaction_identifier<false>::operator<
                      (&((b->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->hash,
                       &((a->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->hash);
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const CTxMemPoolEntry& a, const CTxMemPoolEntry& b) const
    {
        double f1 = (double)a.GetFee() * b.GetTxSize();
        double f2 = (double)b.GetFee() * a.GetTxSize();
        if (f1 == f2) {
            return b.GetTx().GetHash() < a.GetTx().GetHash();
        }
        return f1 > f2;
    }